

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O2

void R_InitTranslationTables(void)

{
  FRemapTable *pFVar1;
  char cVar2;
  BYTE BVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  int j;
  long lVar7;
  BYTE *pBVar8;
  int iVar9;
  bool bVar10;
  BYTE IcePaletteRemap [16];
  
  iVar9 = 8;
  while( true ) {
    PushIdentityTable(1);
    bVar10 = iVar9 == 0;
    iVar9 = iVar9 + -1;
    if (bVar10) break;
    PushIdentityTable(2);
    PushIdentityTable(9);
  }
  iVar9 = 8;
  while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
    PushIdentityTable(3);
  }
  iVar9 = 0x20;
  while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
    PushIdentityTable(6);
  }
  if ((gameinfo.gametype & GAME_DoomChex) == GAME_Any) {
    if (gameinfo.gametype == GAME_Heretic) {
      cVar2 = -0x1f;
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array)->Ptr->Remap
        [lVar4 + 0xe1] = cVar2 + 0x91;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[1].Ptr)->Remap
        [lVar4 + 0xe1] = cVar2 + 0xb0;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[2].Ptr)->Remap
        [lVar4 + 0xe1] = cVar2 + 0xdd;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array)->Ptr->Palette
        [lVar4 + 0xe1].field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)
             (GPalette.BaseColors[lVar4 + 0x72].field_0.d | 0xff000000);
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[1].Ptr)->Palette
        [lVar4 + 0xe1].field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)
             (GPalette.BaseColors[lVar4 + 0x91].field_0.d | 0xff000000);
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[2].Ptr)->Palette
        [lVar4 + 0xe1].field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)
             (GPalette.BaseColors[lVar4 + 0xbe].field_0.d | 0xff000000);
        cVar2 = cVar2 + '\x01';
      }
    }
    else if (gameinfo.gametype == GAME_Strife) {
      for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
        BVar3 = (BYTE)lVar4;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array)->Ptr->Remap
        [lVar4 + 0x20] = BVar3;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[1].Ptr)->Remap
        [lVar4 + 0x20] = BVar3;
        bVar5 = BVar3 + 0x20 & 0xf | 0xd0;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[2].Ptr)->Remap
        [lVar4 + 0x20] = bVar5;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[3].Ptr)->Remap
        [lVar4 + 0x20] = bVar5;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[4].Ptr)->Remap
        [lVar4 + 0x20] = BVar3;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[5].Ptr)->Remap
        [lVar4 + 0x20] = BVar3;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[6].Ptr)->Remap
        [lVar4 + 0x20] = BVar3;
      }
      for (lVar4 = 0x50; lVar4 != 0x60; lVar4 = lVar4 + 1) {
        bVar5 = (byte)lVar4 & 0xf;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[4].Ptr)->Remap
        [lVar4] = bVar5 + 0x80;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[5].Ptr)->Remap
        [lVar4] = bVar5 + 0x10;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[6].Ptr)->Remap
        [lVar4] = bVar5 | 0x40;
      }
      for (lVar4 = 0x80; lVar4 != 0x90; lVar4 = lVar4 + 1) {
        bVar5 = (byte)lVar4 & 0xf;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array)->Ptr->Remap[lVar4]
             = bVar5 + 0x40;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[1].Ptr)->Remap
        [lVar4] = bVar5 + 0xb0;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[2].Ptr)->Remap
        [lVar4] = bVar5 + 0x10;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[3].Ptr)->Remap
        [lVar4] = bVar5 + 0x30;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[4].Ptr)->Remap
        [lVar4] = bVar5 + 0x50;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[5].Ptr)->Remap
        [lVar4] = bVar5 + 0x60;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[6].Ptr)->Remap
        [lVar4] = bVar5 | 0x90;
      }
      for (lVar4 = 0xc0; lVar4 != 0xd0; lVar4 = lVar4 + 1) {
        bVar5 = (byte)lVar4 & 0xf;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[4].Ptr)->Remap
        [lVar4] = bVar5 + 0xa0;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[5].Ptr)->Remap
        [lVar4] = bVar5 + 0x20;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[6].Ptr)->Remap
        [lVar4] = bVar5;
      }
      (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[6].Ptr)->Remap[0xc0] =
           '\x01';
      for (lVar4 = 0xd0; lVar4 != 0xe0; lVar4 = lVar4 + 1) {
        bVar5 = (byte)lVar4 & 0xf;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[4].Ptr)->Remap
        [lVar4] = bVar5 + 0xb0;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[5].Ptr)->Remap
        [lVar4] = bVar5 + 0x30;
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[6].Ptr)->Remap
        [lVar4] = bVar5 | 0x10;
      }
      for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array)->Ptr->Remap
        [lVar4 + 0xf1] = (char)lVar4 + 0xe0;
      }
      for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
        (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array)->Ptr->Remap
        [lVar4 + 0xf7] = (char)lVar4 + 0xf1;
      }
      for (lVar4 = 0; lVar7 = 0x20, lVar4 != 7; lVar4 = lVar4 + 1) {
        for (; lVar7 != 0xfc; lVar7 = lVar7 + 1) {
          (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[lVar4].Ptr)->
          Palette[lVar7].field_0 =
               (anon_union_4_2_12391d7c_for_PalEntry_0)
               (GPalette.BaseColors
                [(translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[lVar4].Ptr)
                 ->Remap[lVar7]].field_0.d | 0xff000000);
        }
      }
    }
  }
  else {
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      uVar6 = (int)lVar4 + 0x70U & 0xf;
      (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array)->Ptr->Remap
      [lVar4 + 0x70] = (BYTE)(uVar6 + 0x60);
      (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[1].Ptr)->Remap
      [lVar4 + 0x70] = (BYTE)(uVar6 + 0x40);
      (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[2].Ptr)->Remap
      [lVar4 + 0x70] = (BYTE)(uVar6 | 0x20);
      (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array)->Ptr->Palette
      [lVar4 + 0x70].field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)
           (GPalette.BaseColors[uVar6 + 0x60].field_0.d | 0xff000000);
      (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[1].Ptr)->Palette
      [lVar4 + 0x70].field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)
           (GPalette.BaseColors[uVar6 + 0x40].field_0.d | 0xff000000);
      (translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[2].Ptr)->Palette
      [lVar4 + 0x70].field_0 =
           (anon_union_4_2_12391d7c_for_PalEntry_0)
           (GPalette.BaseColors[uVar6 | 0x20].field_0.d | 0xff000000);
    }
  }
  pBVar8 = IcePalette[0] + 2;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    BVar3 = FColorMatcher::Pick(&ColorMatcher,(uint)(*(BYTE (*) [3])(pBVar8 + -2))[0],
                                (uint)pBVar8[-1],(uint)*pBVar8);
    IcePaletteRemap[lVar4] = BVar3;
    pBVar8 = pBVar8 + 3;
  }
  pFVar1 = translationtables[3].super_TArray<FRemapTablePtr,_FRemapTable_*>.Array[7].Ptr;
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    uVar6 = (uint)GPalette.BaseColors[lVar4].field_0.field_0.b * 0x25 +
            (uint)GPalette.BaseColors[lVar4].field_0.field_0.g * 0x8f +
            (uint)GPalette.BaseColors[lVar4].field_0.field_0.r * 0x4d >> 0xc;
    pFVar1->Remap[lVar4] = IcePaletteRemap[uVar6];
    pFVar1->Palette[lVar4].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)
         ((uint)IcePalette[uVar6][1] << 8 | (uint)IcePalette[uVar6][0] << 0x10 |
          (uint)IcePalette[uVar6][2] | 0xff000000);
  }
  return;
}

Assistant:

void R_InitTranslationTables ()
{
	int i;

	// Each player gets two translations. Doom and Strife don't use the
	// extra ones, but Heretic and Hexen do. These are set up during
	// netgame arbitration and as-needed, so they just get to be identity
	// maps until then so they won't be invalid.
	for (i = 0; i < MAXPLAYERS; ++i)
	{
		PushIdentityTable(TRANSLATION_Players);
		PushIdentityTable(TRANSLATION_PlayersExtra);
		PushIdentityTable(TRANSLATION_RainPillar);
	}
	// The menu player also gets a separate translation table
	PushIdentityTable(TRANSLATION_Players);

	// The three standard translations from Doom or Heretic (seven for Strife),
	// plus the generic ice translation.
	for (i = 0; i < 8; ++i)
	{
		PushIdentityTable(TRANSLATION_Standard);
	}

	// Each player corpse has its own translation so they won't change
	// color if the player who created them changes theirs.
	for (i = 0; i < BODYQUESIZE; ++i)
	{
		PushIdentityTable(TRANSLATION_PlayerCorpses);
	}

	// Create the standard translation tables
	if (gameinfo.gametype & GAME_DoomChex)
	{
		for (i = 0x70; i < 0x80; i++)
		{ // map green ramp to gray, brown, red
			translationtables[TRANSLATION_Standard][0]->Remap[i] = 0x60 + (i&0xf);
			translationtables[TRANSLATION_Standard][1]->Remap[i] = 0x40 + (i&0xf);
			translationtables[TRANSLATION_Standard][2]->Remap[i] = 0x20 + (i&0xf);

			translationtables[TRANSLATION_Standard][0]->Palette[i] = GPalette.BaseColors[0x60 + (i&0xf)] | MAKEARGB(255,0,0,0);
			translationtables[TRANSLATION_Standard][1]->Palette[i] = GPalette.BaseColors[0x40 + (i&0xf)] | MAKEARGB(255,0,0,0);
			translationtables[TRANSLATION_Standard][2]->Palette[i] = GPalette.BaseColors[0x20 + (i&0xf)] | MAKEARGB(255,0,0,0);
		}
	}
	else if (gameinfo.gametype == GAME_Heretic)
	{
		for (i = 225; i <= 240; i++)
		{
			translationtables[TRANSLATION_Standard][0]->Remap[i] = 114+(i-225); // yellow
			translationtables[TRANSLATION_Standard][1]->Remap[i] = 145+(i-225); // red
			translationtables[TRANSLATION_Standard][2]->Remap[i] = 190+(i-225); // blue
			
			translationtables[TRANSLATION_Standard][0]->Palette[i] = GPalette.BaseColors[114+(i-225)] | MAKEARGB(255,0,0,0);
			translationtables[TRANSLATION_Standard][1]->Palette[i] = GPalette.BaseColors[145+(i-225)] | MAKEARGB(255,0,0,0);
			translationtables[TRANSLATION_Standard][2]->Palette[i] = GPalette.BaseColors[190+(i-225)] | MAKEARGB(255,0,0,0);
		}
	}
	else if (gameinfo.gametype == GAME_Strife)
	{
		for (i = 0x20; i <= 0x3F; ++i)
		{
			translationtables[TRANSLATION_Standard][0]->Remap[i] = i - 0x20;
			translationtables[TRANSLATION_Standard][1]->Remap[i] = i - 0x20;
			translationtables[TRANSLATION_Standard][2]->Remap[i] = 0xD0 + (i&0xf);
			translationtables[TRANSLATION_Standard][3]->Remap[i] = 0xD0 + (i&0xf);
			translationtables[TRANSLATION_Standard][4]->Remap[i] = i - 0x20;
			translationtables[TRANSLATION_Standard][5]->Remap[i] = i - 0x20;
			translationtables[TRANSLATION_Standard][6]->Remap[i] = i - 0x20;
		}
		for (i = 0x50; i <= 0x5F; ++i)
		{
			// Merchant hair
			translationtables[TRANSLATION_Standard][4]->Remap[i] = 0x80 + (i&0xf);
			translationtables[TRANSLATION_Standard][5]->Remap[i] = 0x10 + (i&0xf);
			translationtables[TRANSLATION_Standard][6]->Remap[i] = 0x40 + (i&0xf);
		}
		for (i = 0x80; i <= 0x8F; ++i)
		{
			translationtables[TRANSLATION_Standard][0]->Remap[i] = 0x40 + (i&0xf); // red
			translationtables[TRANSLATION_Standard][1]->Remap[i] = 0xB0 + (i&0xf); // rust
			translationtables[TRANSLATION_Standard][2]->Remap[i] = 0x10 + (i&0xf); // gray
			translationtables[TRANSLATION_Standard][3]->Remap[i] = 0x30 + (i&0xf); // dark green
			translationtables[TRANSLATION_Standard][4]->Remap[i] = 0x50 + (i&0xf); // gold
			translationtables[TRANSLATION_Standard][5]->Remap[i] = 0x60 + (i&0xf); // bright green
			translationtables[TRANSLATION_Standard][6]->Remap[i] = 0x90 + (i&0xf); // blue
		}
		for (i = 0xC0; i <= 0xCF; ++i)
		{
			translationtables[TRANSLATION_Standard][4]->Remap[i] = 0xA0 + (i&0xf);
			translationtables[TRANSLATION_Standard][5]->Remap[i] = 0x20 + (i&0xf);
			translationtables[TRANSLATION_Standard][6]->Remap[i] = (i&0xf);
		}
		translationtables[TRANSLATION_Standard][6]->Remap[0xC0] = 1;
		for (i = 0xD0; i <= 0xDF; ++i)
		{
			translationtables[TRANSLATION_Standard][4]->Remap[i] = 0xB0 + (i&0xf);
			translationtables[TRANSLATION_Standard][5]->Remap[i] = 0x30 + (i&0xf);
			translationtables[TRANSLATION_Standard][6]->Remap[i] = 0x10 + (i&0xf);
		}
		for (i = 0xF1; i <= 0xF6; ++i)
		{
			translationtables[TRANSLATION_Standard][0]->Remap[i] = 0xDF + (i&0xf);
		}
		for (i = 0xF7; i <= 0xFB; ++i)
		{
			translationtables[TRANSLATION_Standard][0]->Remap[i] = i - 6;
		}
		for (i = 0; i < 7; ++i)
		{
			for (int j = 0x20; j <= 0xFB; ++j)
			{
				translationtables[TRANSLATION_Standard][i]->Palette[j] =
					GPalette.BaseColors[translationtables[TRANSLATION_Standard][i]->Remap[j]] | MAKEARGB(255,0,0,0);
			}
		}
	}

	// Create the ice translation table, based on Hexen's. Alas, the standard
	// Doom palette has no good substitutes for these bluish-tinted grays, so
	// they will just look gray unless you use a different PLAYPAL with Doom.

	BYTE IcePaletteRemap[16];
	for (i = 0; i < 16; ++i)
	{
		IcePaletteRemap[i] = ColorMatcher.Pick (IcePalette[i][0], IcePalette[i][1], IcePalette[i][2]);
	}
	FRemapTable *remap = translationtables[TRANSLATION_Standard][7];
	for (i = 0; i < 256; ++i)
	{
		int r = GPalette.BaseColors[i].r;
		int g = GPalette.BaseColors[i].g;
		int b = GPalette.BaseColors[i].b;
		int v = (r*77 + g*143 + b*37) >> 12;
		remap->Remap[i] = IcePaletteRemap[v];
		remap->Palette[i] = PalEntry(255, IcePalette[v][0], IcePalette[v][1], IcePalette[v][2]);
	}
}